

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::~ansicolor_sink
          (ansicolor_sink<spdlog::details::console_mutex> *this)

{
  long *plVar1;
  long *plVar2;
  formatter *pfVar3;
  long lVar4;
  
  (this->super_sink)._vptr_sink = (_func_int **)&PTR__ansicolor_sink_005551e0;
  lVar4 = 0;
  do {
    plVar1 = (long *)((this->colors_)._M_elems[6].field_2._M_local_buf + lVar4);
    plVar2 = *(long **)((long)&(this->colors_)._M_elems[6]._M_dataplus._M_p + lVar4);
    if (plVar1 != plVar2) {
      operator_delete(plVar2,*plVar1 + 1);
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0xe0);
  pfVar3 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  if (pfVar3 != (formatter *)0x0) {
    (*pfVar3->_vptr_formatter[1])();
  }
  (this->formatter_)._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  return;
}

Assistant:

~ansicolor_sink() override = default;